

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

__pid_t __thiscall
kj::Promise<kj::Maybe<kj::Own<kj::AsyncIoStream>_>_>::wait
          (Promise<kj::Maybe<kj::Own<kj::AsyncIoStream>_>_> *this,void *__stat_loc)

{
  anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *exception;
  WaitScope *in_RDX;
  ExceptionOr<kj::Maybe<kj::Own<kj::AsyncIoStream>_>_> result;
  ExceptionOrValue local_190;
  char local_30;
  Disposer *local_28;
  PromiseNode *local_20;
  
  local_190.exception.ptr.isSet = false;
  local_30 = '\0';
  _::waitImpl((Own<kj::_::PromiseNode> *)__stat_loc,&local_190,in_RDX);
  if (local_30 == '\x01') {
    exception = &local_190.exception.ptr.field_1;
    if (local_190.exception.ptr.isSet != false) {
      throwRecoverableException(&exception->value,0);
    }
    (this->super_PromiseBase).node.disposer = local_28;
    (this->super_PromiseBase).node.ptr = local_20;
    local_20 = (PromiseNode *)0x0;
    if (local_190.exception.ptr.isSet == true) {
      Exception::~Exception(&exception->value);
    }
    return (__pid_t)this;
  }
  if (local_190.exception.ptr.isSet != false) {
    throwFatalException(&local_190.exception.ptr.field_1.value,0);
  }
  _::unreachable();
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope) {
  _::ExceptionOr<_::FixVoid<T>> result;

  _::waitImpl(kj::mv(node), result, waitScope);

  KJ_IF_MAYBE(value, result.value) {
    KJ_IF_MAYBE(exception, result.exception) {
      throwRecoverableException(kj::mv(*exception));
    }
    return _::returnMaybeVoid(kj::mv(*value));
  } else KJ_IF_MAYBE(exception, result.exception) {
    throwFatalException(kj::mv(*exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }